

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3VdbeMemIntegerify(Mem *pMem)

{
  i64 iVar1;
  Mem *pMem_local;
  
  iVar1 = sqlite3VdbeIntValue(pMem);
  (pMem->u).i = iVar1;
  pMem->flags = pMem->flags & 0x3e20 | 4;
  return 0;
}

Assistant:

SQLITE_PRIVATE int sqlite3VdbeMemIntegerify(Mem *pMem){
  assert( pMem->db==0 || sqlite3_mutex_held(pMem->db->mutex) );
  assert( !sqlite3VdbeMemIsRowSet(pMem) );
  assert( EIGHT_BYTE_ALIGNMENT(pMem) );

  pMem->u.i = sqlite3VdbeIntValue(pMem);
  MemSetTypeFlag(pMem, MEM_Int);
  return SQLITE_OK;
}